

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::IntermediateNode::
destroyChildren(IntermediateNode *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*> *in_RDI;
  NodeIterator children;
  IntermediateNode *in;
  Node *n;
  Node *in_stack_ffffffffffffffa8;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
  *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 local_30 [8];
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*> *local_28
  ;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*> *local_20
  ;
  
  if ((destroyChildren()::toDelete == '\0') &&
     (iVar2 = __cxa_guard_acquire(&destroyChildren()::toDelete), iVar2 != 0)) {
    Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>::
    Stack((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
           *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
         );
    __cxa_atexit(Lib::
                 Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
                 ::~Stack,&destroyChildren::toDelete,&__dso_handle);
    __cxa_guard_release(&destroyChildren()::toDelete);
  }
  Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>::
  reset(&destroyChildren::toDelete);
  Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>::
  push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  while (bVar1 = Lib::
                 Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
                 ::isNonEmpty(&destroyChildren::toDelete), bVar1) {
    local_20 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
                *)Lib::
                  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>
                  ::pop(&destroyChildren::toDelete);
    uVar3 = (*((_func_int **)local_20->_capacity)[2])();
    if ((uVar3 & 1) == 0) {
      local_28 = local_20;
      (*((_func_int **)local_20->_capacity)[8])(local_30);
      while (bVar1 = Lib::
                     VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                     ::hasNext((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                                *)0x429f9f), bVar1) {
        Lib::
        VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
        ::next((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                *)0x429fb9);
        Lib::
        Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*>::
        push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      (*((_func_int **)local_28->_capacity)[0xc])();
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
      ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                          *)in_stack_ffffffffffffffb0);
    }
    if ((local_20 != in_RDI) &&
       (in_stack_ffffffffffffffb0 = local_20,
       local_20 !=
       (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*> *)
       0x0)) {
      (*((_func_int **)local_20->_capacity)[1])();
    }
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::destroyChildren()
{
  static Stack<Node*> toDelete;
  toDelete.reset();
  toDelete.push(this);
  while(toDelete.isNonEmpty()) {
    Node* n=toDelete.pop();
    if(!n->isLeaf()) {
      IntermediateNode* in=static_cast<IntermediateNode*>(n);
      NodeIterator children=in->allChildren();
      while(children.hasNext()) {
	toDelete.push(*children.next());
      }
      in->removeAllChildren();
    }
    if(n!=this) {
      delete n;
    }
  }
}